

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecmult_const_impl.h
# Opt level: O3

int secp256k1_ecmult_const_xonly
              (secp256k1_fe *r,secp256k1_fe *n,secp256k1_fe *d,secp256k1_scalar *q,
              int known_on_curve)

{
  char *pcVar1;
  uint *pk_parity;
  undefined8 uVar2;
  bool bVar3;
  undefined4 uVar4;
  int iVar5;
  int iVar6;
  uint32_t uVar7;
  int iVar8;
  ulong uVar9;
  FILE *__stream;
  size_t sVar10;
  secp256k1_ge *psVar11;
  secp256k1_gej *psVar12;
  ulong extraout_RAX;
  uint uVar13;
  uint uVar14;
  secp256k1_fe *psVar15;
  ulong uVar17;
  size_t len;
  secp256k1_gej *gen;
  secp256k1_gej *gen_00;
  uint uVar18;
  char *pcVar19;
  undefined1 *puVar20;
  FILE *pFVar21;
  undefined1 *puVar22;
  secp256k1_context *psVar23;
  uint64_t *puVar24;
  undefined8 *puVar25;
  secp256k1_context *psVar26;
  secp256k1_context *psVar27;
  secp256k1_context *psVar28;
  ulong uVar29;
  uint64_t uVar30;
  long lVar31;
  secp256k1_scalar *psVar32;
  uint uVar33;
  uint uVar34;
  int iVar35;
  long lVar36;
  long lVar37;
  secp256k1_keypair *keypair;
  uchar *puVar38;
  secp256k1_gej *psVar39;
  secp256k1_ge *b;
  ulong uVar40;
  secp256k1_xonly_pubkey *psVar41;
  bool bVar42;
  byte bVar43;
  secp256k1_fe i;
  secp256k1_gej rj;
  secp256k1_ge p;
  secp256k1_gej *psStack_1c48;
  secp256k1_gej *psStack_1c40;
  ulong uStack_1c30;
  long lStack_1c28;
  int iStack_1c14;
  secp256k1_context *psStack_1c10;
  ulong uStack_1c08;
  undefined1 auStack_1c00 [16];
  undefined1 auStack_1bf0 [16];
  undefined1 auStack_1be0 [16];
  int iStack_1bd0;
  uint uStack_1bc4;
  undefined1 auStack_1bc0 [16];
  secp256k1_callback sStack_1bb0;
  int iStack_1b94;
  undefined1 auStack_1b90 [48];
  _func_void_char_ptr_void_ptr *p_Stack_1b60;
  void *pvStack_1b58;
  secp256k1_callback sStack_1b50;
  undefined1 auStack_1b40 [16];
  undefined1 *puStack_1b30;
  long lStack_1b28;
  undefined1 *puStack_1b20;
  secp256k1_schnorrsig_extraparams sStack_1b18;
  undefined1 auStack_1b00 [16];
  secp256k1_callback sStack_1af0;
  secp256k1_callback sStack_1ae0;
  undefined1 auStack_1ad0 [16];
  undefined1 auStack_19a0 [32];
  uchar auStack_1980 [32];
  undefined1 auStack_1960 [56];
  uchar auStack_1928 [8];
  undefined1 auStack_1920 [16];
  uint64_t uStack_1910;
  uint64_t uStack_1908;
  int iStack_1900;
  uchar auStack_1680 [8];
  undefined8 uStack_1678;
  secp256k1_callback sStack_1670;
  undefined1 auStack_1660 [16];
  secp256k1_callback sStack_1650;
  uint64_t uStack_1640;
  int iStack_1634;
  secp256k1_keypair sStack_13c0;
  secp256k1_context asStack_1360 [5];
  undefined1 auStack_ee0 [1248];
  secp256k1_ge sStack_a00;
  undefined1 auStack_998 [8];
  undefined1 auStack_990 [152];
  secp256k1_context asStack_8f8 [9];
  secp256k1_context *psStack_1d8;
  secp256k1_fe *psStack_1d0;
  secp256k1_context *psStack_1c8;
  secp256k1_fe *psStack_1c0;
  secp256k1_scalar *psStack_1b8;
  code *pcStack_1b0;
  secp256k1_fe *local_1a0;
  undefined1 local_198 [24];
  uint64_t uStack_180;
  uint64_t local_178;
  int local_170;
  int local_16c;
  secp256k1_fe local_168;
  undefined1 local_138 [24];
  uint64_t uStack_120;
  uint64_t local_118;
  int local_110;
  int local_10c;
  secp256k1_fe local_d8;
  int local_a8;
  int local_38;
  int *piVar16;
  
  bVar43 = 0;
  psVar27 = (secp256k1_context *)local_198;
  pcStack_1b0 = (code *)0x1159a0;
  secp256k1_fe_sqr((secp256k1_fe *)psVar27,n);
  pcStack_1b0 = (code *)0x1159ae;
  secp256k1_fe_mul((secp256k1_fe *)psVar27,(secp256k1_fe *)psVar27,n);
  local_1a0 = r;
  if (d == (secp256k1_fe *)0x0) {
    pcStack_1b0 = (code *)0x115b66;
    secp256k1_fe_verify((secp256k1_fe *)local_198);
    local_198._0_8_ = local_198._0_8_ + 2;
    local_170 = local_170 + 1;
    local_16c = 0;
    pcStack_1b0 = (code *)0x115b7c;
    secp256k1_fe_verify((secp256k1_fe *)local_198);
    if (known_on_curve == 0) {
      psVar15 = (secp256k1_fe *)local_198;
LAB_00115b85:
      pcStack_1b0 = (code *)0x115b8a;
      iVar5 = secp256k1_fe_is_square_var(psVar15);
      if (iVar5 == 0) {
        return 0;
      }
    }
LAB_00115b92:
    r = (secp256k1_fe *)local_198;
    pcStack_1b0 = (code *)0x115baa;
    secp256k1_fe_mul((secp256k1_fe *)&stack0xffffffffffffff68,r,n);
    n = (secp256k1_fe *)&stack0xffffffffffffff98;
    pcStack_1b0 = (code *)0x115bbd;
    psVar23 = (secp256k1_context *)r;
    secp256k1_fe_sqr(n,r);
    local_38 = 0;
    psVar26 = (secp256k1_context *)(ulong)*q;
    pcStack_1b0 = (code *)0x115bce;
    secp256k1_scalar_verify((secp256k1_scalar *)psVar26);
    if (*q == 0) {
      pcStack_1b0 = (code *)0x115c7d;
      secp256k1_ecmult_const_xonly_cold_5();
    }
    else {
      r = (secp256k1_fe *)local_138;
      psVar23 = (secp256k1_context *)&stack0xffffffffffffff68;
      pcStack_1b0 = (code *)0x115bf0;
      secp256k1_ecmult_const((secp256k1_gej *)r,(secp256k1_ge *)psVar23,q);
      pcStack_1b0 = (code *)0x115bf8;
      psVar26 = (secp256k1_context *)r;
      secp256k1_gej_verify((secp256k1_gej *)r);
      if (local_a8 == 0) {
        pcStack_1b0 = (code *)0x115c16;
        secp256k1_fe_sqr(&local_168,&local_d8);
        pcStack_1b0 = (code *)0x115c26;
        secp256k1_fe_mul(&local_168,&local_168,(secp256k1_fe *)local_198);
        if (d != (secp256k1_fe *)0x0) {
          pcStack_1b0 = (code *)0x115c3b;
          secp256k1_fe_mul(&local_168,&local_168,d);
        }
        pcStack_1b0 = (code *)0x115c4b;
        secp256k1_fe_inv(&local_168,&local_168);
        pcStack_1b0 = (code *)0x115c5d;
        secp256k1_fe_mul(local_1a0,(secp256k1_fe *)local_138,&local_168);
        return 1;
      }
    }
    pcStack_1b0 = (code *)0x115c82;
    secp256k1_ecmult_const_xonly_cold_4();
LAB_00115c82:
    uVar18 = (uint)psVar26;
    pcStack_1b0 = (code *)0x115c87;
    secp256k1_ecmult_const_xonly_cold_1();
  }
  else {
    pcStack_1b0 = (code *)0x1159c4;
    secp256k1_fe_verify(d);
    uVar9 = (d->n[4] >> 0x30) * 0x1000003d1 + d->n[0];
    uVar17 = (uVar9 >> 0x34) + d->n[1];
    psVar23 = (secp256k1_context *)((uVar17 >> 0x34) + d->n[2]);
    psVar26 = (secp256k1_context *)(((ulong)psVar23 >> 0x34) + d->n[3]);
    uVar29 = ((ulong)psVar26 >> 0x34) + (d->n[4] & 0xffffffffffff);
    if ((((uVar17 | uVar9 | (ulong)psVar23 | (ulong)psVar26) & 0xfffffffffffff) == 0 && uVar29 == 0)
       || (((uVar9 ^ 0x1000003d0) & uVar17 & (ulong)psVar23 & (ulong)psVar26 &
           (uVar29 ^ 0xf000000000000)) == 0xfffffffffffff)) goto LAB_00115c82;
    psVar27 = (secp256k1_context *)local_138;
    pcStack_1b0 = (code *)0x115a70;
    psVar23 = (secp256k1_context *)d;
    secp256k1_fe_sqr((secp256k1_fe *)psVar27,d);
    pcStack_1b0 = (code *)0x115a78;
    psVar26 = psVar27;
    secp256k1_fe_verify((secp256k1_fe *)psVar27);
    uVar18 = (uint)psVar26;
    if (local_110 < 0x11) {
      psVar27 = (secp256k1_context *)local_138;
      local_138._0_8_ = local_138._0_8_ * 2;
      local_138._8_8_ = local_138._8_8_ * 2;
      uStack_120 = uStack_120 * 2;
      local_138._16_8_ = local_138._16_8_ * 2;
      local_118 = local_118 << 1;
      local_110 = local_110 * 2;
      local_10c = 0;
      pcStack_1b0 = (code *)0x115ac4;
      secp256k1_fe_verify((secp256k1_fe *)psVar27);
      pcStack_1b0 = (code *)0x115ad2;
      psVar23 = psVar27;
      secp256k1_fe_mul((secp256k1_fe *)psVar27,(secp256k1_fe *)psVar27,d);
      r = (secp256k1_fe *)local_198;
      pcStack_1b0 = (code *)0x115adf;
      secp256k1_fe_verify(r);
      pcStack_1b0 = (code *)0x115ae7;
      psVar26 = psVar27;
      secp256k1_fe_verify((secp256k1_fe *)psVar27);
      uVar18 = (uint)psVar26;
      if (0x20 < local_110 + local_170) goto LAB_00115c8c;
      local_198._0_8_ = local_198._0_8_ + local_138._0_8_;
      local_198._8_8_ = local_198._8_8_ + local_138._8_8_;
      local_198._16_8_ = local_198._16_8_ + local_138._16_8_;
      uStack_180 = uStack_180 + uStack_120;
      local_178 = local_178 + local_118;
      local_16c = 0;
      pcStack_1b0 = (code *)0x115b38;
      local_170 = local_110 + local_170;
      secp256k1_fe_verify((secp256k1_fe *)local_198);
      if (known_on_curve == 0) {
        psVar15 = (secp256k1_fe *)&stack0xffffffffffffff68;
        pcStack_1b0 = (code *)0x115b54;
        secp256k1_fe_mul(psVar15,(secp256k1_fe *)local_198,d);
        goto LAB_00115b85;
      }
      goto LAB_00115b92;
    }
  }
  pcStack_1b0 = (code *)0x115c8c;
  secp256k1_ecmult_const_xonly_cold_3();
LAB_00115c8c:
  pcStack_1b0 = main;
  secp256k1_ecmult_const_xonly_cold_2();
  psStack_1d8 = (secp256k1_context *)r;
  psStack_1d0 = n;
  psStack_1c8 = psVar27;
  psStack_1c0 = d;
  psStack_1b8 = q;
  pcStack_1b0 = (code *)(ulong)(uint)known_on_curve;
  setbuf(_stdout,(char *)0x0);
  setbuf(_stderr,(char *)0x0);
  printf("Exhaustive tests for order %lu\n");
  psStack_1c48 = (secp256k1_gej *)(ulong)uVar18;
  psStack_1c10 = psVar23;
  if ((int)uVar18 < 2) {
    printf("test count = %i\n",(ulong)(uint)count);
  }
  else {
    uVar9 = strtol((char *)(psVar23->ecmult_gen_ctx).ge_offset.x.n[0],(char **)0x0,0);
    count = (int)uVar9;
    printf("test count = %i\n",uVar9 & 0xffffffff);
    if (uVar18 != 2) {
      pcVar19 = (char *)(psVar23->ecmult_gen_ctx).ge_offset.x.n[1];
      asStack_1360[0].ecmult_gen_ctx.built = 0;
      asStack_1360[0].ecmult_gen_ctx.scalar_offset = 0;
      asStack_1360[0].ecmult_gen_ctx.ge_offset.x.n[0] = 0;
      if ((pcVar19 != (char *)0x0) && (*pcVar19 != '\0')) {
        lVar36 = 0;
        do {
          psStack_1c48._0_4_ = uVar18;
          if (pcVar19[1] == '\0') goto LAB_00115df6;
          iVar5 = __isoc99_sscanf(pcVar19,"%2hx",auStack_990);
          if (iVar5 != 1) goto LAB_00115df6;
          *(undefined1 *)((long)asStack_1360[0].ecmult_gen_ctx.ge_offset.x.n + lVar36 + -8) =
               auStack_990[0];
          if (lVar36 == 0xf) goto LAB_00115df6;
          lVar36 = lVar36 + 1;
          pcVar1 = pcVar19 + 2;
          pcVar19 = pcVar19 + 2;
          if (*pcVar1 == '\0') goto LAB_00115df6;
        } while( true );
      }
    }
  }
  asStack_1360[0].ecmult_gen_ctx.ge_offset.x.n[0] = 0;
  asStack_1360[0].ecmult_gen_ctx.built = 0;
  asStack_1360[0].ecmult_gen_ctx.scalar_offset = 0;
  __stream = fopen("/dev/urandom","rb");
  if ((__stream != (FILE *)0x0) && (sVar10 = fread(asStack_1360,1,0x10,__stream), sVar10 == 0x10))
  goto LAB_00115dee;
LAB_00117cf5:
  main_cold_1();
  uVar18 = (uint)psStack_1c48;
  if ((extraout_RAX & 1) == 0) {
LAB_00115dee:
    psStack_1c48._0_4_ = uVar18;
    fclose(__stream);
  }
LAB_00115df6:
  lVar36 = 0;
  printf("random seed = %02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x\n",
         asStack_1360[0].ecmult_gen_ctx._0_8_ & 0xff,
         (ulong)asStack_1360[0].ecmult_gen_ctx._0_8_ >> 8 & 0xff,
         (ulong)asStack_1360[0].ecmult_gen_ctx._0_8_ >> 0x10 & 0xff,
         (ulong)asStack_1360[0].ecmult_gen_ctx._0_8_ >> 0x18 & 0xff,
         (ulong)asStack_1360[0].ecmult_gen_ctx._0_8_ >> 0x20 & 0xff,
         (ulong)asStack_1360[0].ecmult_gen_ctx._0_8_ >> 0x28 & 0xff,
         (ulong)asStack_1360[0].ecmult_gen_ctx._0_8_ >> 0x30 & 0xff,
         (ulong)asStack_1360[0].ecmult_gen_ctx._0_8_ >> 0x38,
         asStack_1360[0].ecmult_gen_ctx.ge_offset.x.n[0] & 0xff,
         asStack_1360[0].ecmult_gen_ctx.ge_offset.x.n[0] >> 8 & 0xff,
         asStack_1360[0].ecmult_gen_ctx.ge_offset.x.n[0] >> 0x10 & 0xff,
         asStack_1360[0].ecmult_gen_ctx.ge_offset.x.n[0] >> 0x18 & 0xff,
         asStack_1360[0].ecmult_gen_ctx.ge_offset.x.n[0] >> 0x20 & 0xff,
         asStack_1360[0].ecmult_gen_ctx.ge_offset.x.n[0] >> 0x28 & 0xff,
         asStack_1360[0].ecmult_gen_ctx.ge_offset.x.n[0] >> 0x30 & 0xff,
         asStack_1360[0].ecmult_gen_ctx.ge_offset.x.n[0] >> 0x38);
  auStack_990._0_8_ = 0xbb67ae856a09e667;
  auStack_990._8_8_ = 0xa54ff53a3c6ef372;
  auStack_990._16_8_ = 0x9b05688c510e527f;
  auStack_990._24_8_ = 0x5be0cd191f83d9ab;
  auStack_990._96_8_ = 0;
  secp256k1_sha256_write((secp256k1_sha256 *)auStack_990,(uchar *)"secp256k1 test init",0x13);
  secp256k1_sha256_write((secp256k1_sha256 *)auStack_990,(uchar *)asStack_1360,0x10);
  puVar38 = auStack_ee0;
  secp256k1_sha256_finalize((secp256k1_sha256 *)auStack_990,puVar38);
  psVar27 = psStack_1c10;
  do {
    psVar15 = (secp256k1_fe *)0x0;
    uVar9 = 0;
    do {
      uVar9 = (ulong)puVar38[(long)psVar15] | uVar9 << 8;
      psVar15 = (secp256k1_fe *)((long)psVar15->n + 1);
    } while (psVar15 != (secp256k1_fe *)0x8);
    secp256k1_test_state[lVar36] = uVar9;
    lVar36 = lVar36 + 1;
    puVar38 = puVar38 + 8;
  } while (lVar36 != 4);
  if (4 < (int)(uint)psStack_1c48) {
    lVar36 = strtol((char *)(psStack_1c10->ecmult_gen_ctx).ge_offset.x.n[2],(char **)0x0,0);
    num_cores = (uint32_t)lVar36;
    uVar9 = strtol((char *)(psVar27->ecmult_gen_ctx).ge_offset.x.n[3],(char **)0x0,0);
    this_core = (uint32_t)uVar9;
    if (((ulong)num_cores == 0) || (num_cores <= this_core)) {
LAB_00117d1d:
      main_cold_2();
      return 1;
    }
    printf("running tests for core %lu (out of [0..%lu])\n",uVar9 & 0xffffffff,(ulong)num_cores - 1)
    ;
  }
  psVar27 = (secp256k1_context *)0xd0;
  psVar11 = (secp256k1_ge *)malloc(0xd0);
  if (psVar11 == (secp256k1_ge *)0x0) goto LAB_00117da2;
  psVar27 = (secp256k1_context *)0x130;
  psVar12 = (secp256k1_gej *)malloc(0x130);
  if (psVar12 != (secp256k1_gej *)0x0) {
    psVar27 = (secp256k1_context *)0x130;
    psStack_1c48 = (secp256k1_gej *)malloc(0x130);
    if (psStack_1c48 == (secp256k1_gej *)0x0) goto LAB_00117dac;
    secp256k1_gej_set_infinity((secp256k1_gej *)auStack_990);
    uVar18 = 0xff;
    do {
      secp256k1_gej_double_var
                ((secp256k1_gej *)auStack_990,(secp256k1_gej *)auStack_990,(secp256k1_fe *)0x0);
      if ((uVar18 < 0x20) && ((7U >> (uVar18 & 0x1f) & 1) != 0)) {
        psVar15 = (secp256k1_fe *)0x0;
        secp256k1_gej_add_ge_var
                  ((secp256k1_gej *)auStack_990,(secp256k1_gej *)auStack_990,&secp256k1_ge_const_g,
                   (secp256k1_fe *)0x0);
      }
      bVar42 = uVar18 != 0;
      uVar18 = uVar18 - 1;
    } while (bVar42);
    psVar23 = (secp256k1_context *)auStack_ee0;
    secp256k1_gej_double_var
              ((secp256k1_gej *)psVar23,(secp256k1_gej *)auStack_990,(secp256k1_fe *)0x0);
    iVar5 = secp256k1_gej_eq_ge_var((secp256k1_gej *)psVar23,&secp256k1_ge_const_g);
    if (iVar5 != 0) {
      secp256k1_gej_set_infinity((secp256k1_gej *)auStack_ee0);
      secp256k1_gej_add_var
                ((secp256k1_gej *)auStack_ee0,(secp256k1_gej *)auStack_ee0,
                 (secp256k1_gej *)auStack_990,psVar15);
      lVar36 = 0;
      secp256k1_gej_double_var
                ((secp256k1_gej *)auStack_990,(secp256k1_gej *)auStack_990,(secp256k1_fe *)0x0);
      memcpy(psVar12,(secp256k1_gej *)auStack_990,0x98);
      secp256k1_gej_double_var
                ((secp256k1_gej *)auStack_990,(secp256k1_gej *)auStack_990,(secp256k1_fe *)0x0);
      secp256k1_gej_add_var
                ((secp256k1_gej *)auStack_ee0,(secp256k1_gej *)auStack_ee0,
                 (secp256k1_gej *)auStack_990,psVar15);
      secp256k1_gej_double_var
                ((secp256k1_gej *)auStack_990,(secp256k1_gej *)auStack_990,(secp256k1_fe *)0x0);
      memcpy(psVar12 + 1,(secp256k1_gej *)auStack_990,0x98);
      secp256k1_gej_neg(psStack_1c48,(secp256k1_gej *)auStack_ee0);
      secp256k1_gej_add_var(psStack_1c48 + 1,psStack_1c48,psVar12,psVar15);
      secp256k1_ge_set_all_gej_var(psVar11,psStack_1c48,len);
      bVar42 = true;
LAB_00116117:
      psVar27 = (secp256k1_context *)(psVar11 + lVar36);
      psVar23 = psVar27;
      secp256k1_ge_verify((secp256k1_ge *)psVar27);
      if (psVar11[lVar36].infinity == 0) goto code_r0x00116133;
      main_cold_3();
LAB_00117d34:
      main_cold_44();
LAB_00117d39:
      main_cold_4();
LAB_00117d3e:
      main_cold_5();
LAB_00117d43:
      main_cold_60();
LAB_00117d48:
      main_cold_59();
LAB_00117d4d:
      main_cold_58();
LAB_00117d52:
      main_cold_6();
LAB_00117d57:
      main_cold_7();
LAB_00117d5c:
      main_cold_52();
LAB_00117d61:
      main_cold_51();
LAB_00117d66:
      main_cold_50();
LAB_00117d6b:
      main_cold_49();
LAB_00117d70:
      main_cold_41();
LAB_00117d75:
      main_cold_47();
    }
    main_cold_62();
LAB_00117d7f:
    psVar28 = psVar23;
    main_cold_46();
LAB_00117d84:
    main_cold_45();
LAB_00117d89:
    psVar27 = psVar28;
    main_cold_43();
LAB_00117d8e:
    main_cold_42();
    goto LAB_00117d93;
  }
  goto LAB_00117da7;
code_r0x00116133:
  secp256k1_ge_to_storage(secp256k1_ecmult_gen_prec_table[0] + lVar36,(secp256k1_ge *)psVar27);
  lVar36 = 1;
  bVar3 = !bVar42;
  bVar42 = false;
  if (bVar3) goto code_r0x00116157;
  goto LAB_00116117;
LAB_00117cd8:
  main_cold_55();
LAB_00117cdd:
  main_cold_54();
LAB_00117ce2:
  main_cold_53();
  goto LAB_00117cf5;
code_r0x00116157:
  free(psStack_1c48);
  free(psVar12);
  free(psVar11);
  secp256k1_gej_set_ge((secp256k1_gej *)auStack_990,&secp256k1_ge_const_g);
  secp256k1_ecmult_compute_table(secp256k1_pre_g,(int)(secp256k1_gej *)auStack_990,gen);
  iVar5 = 0x80;
  do {
    secp256k1_gej_double_var
              ((secp256k1_gej *)auStack_990,(secp256k1_gej *)auStack_990,(secp256k1_fe *)0x0);
    iVar5 = iVar5 + -1;
  } while (iVar5 != 0);
  secp256k1_ecmult_compute_table(secp256k1_pre_g_128,(int)auStack_990,gen_00);
  iVar5 = count;
  while( true ) {
    count = iVar5 + -1;
    if (iVar5 == 0) {
      testrand256((uchar *)asStack_1360);
      printf("random run = %02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x\n",
             asStack_1360[0].ecmult_gen_ctx._0_8_ & 0xff,
             (ulong)asStack_1360[0].ecmult_gen_ctx._0_8_ >> 8 & 0xff,
             (ulong)asStack_1360[0].ecmult_gen_ctx._0_8_ >> 0x10 & 0xff,
             (ulong)asStack_1360[0].ecmult_gen_ctx._0_8_ >> 0x18 & 0xff,
             (ulong)asStack_1360[0].ecmult_gen_ctx._0_8_ >> 0x20 & 0xff,
             (ulong)asStack_1360[0].ecmult_gen_ctx._0_8_ >> 0x28 & 0xff,
             (ulong)asStack_1360[0].ecmult_gen_ctx._0_8_ >> 0x30 & 0xff,
             (ulong)asStack_1360[0].ecmult_gen_ctx._0_8_ >> 0x38,
             asStack_1360[0].ecmult_gen_ctx.ge_offset.x.n[0] & 0xff,
             asStack_1360[0].ecmult_gen_ctx.ge_offset.x.n[0] >> 8 & 0xff,
             asStack_1360[0].ecmult_gen_ctx.ge_offset.x.n[0] >> 0x10 & 0xff,
             asStack_1360[0].ecmult_gen_ctx.ge_offset.x.n[0] >> 0x18 & 0xff,
             asStack_1360[0].ecmult_gen_ctx.ge_offset.x.n[0] >> 0x20 & 0xff,
             asStack_1360[0].ecmult_gen_ctx.ge_offset.x.n[0] >> 0x28 & 0xff,
             asStack_1360[0].ecmult_gen_ctx.ge_offset.x.n[0] >> 0x30 & 0xff,
             asStack_1360[0].ecmult_gen_ctx.ge_offset.x.n[0] >> 0x38);
      puts("no problems found");
      return 0;
    }
    psVar26 = secp256k1_context_create(1);
    testrand256(auStack_1980);
    psVar27 = psVar26;
    iVar5 = secp256k1_context_randomize(psVar26,auStack_1980);
    if (iVar5 == 0) break;
    psStack_1c10 = psVar26;
    secp256k1_gej_set_infinity((secp256k1_gej *)auStack_990);
    secp256k1_ge_set_gej((secp256k1_ge *)auStack_ee0,(secp256k1_gej *)auStack_990);
    lVar36 = -0x4e0;
    uVar18 = 1;
    psVar12 = (secp256k1_gej *)auStack_990;
    do {
      psVar39 = psVar12 + 1;
      secp256k1_gej_add_ge(psVar39,psVar12,&secp256k1_ge_const_g);
      secp256k1_ge_set_gej((secp256k1_ge *)(auStack_998 + lVar36),psVar39);
      if (count != 0) {
        testutil_random_fe((secp256k1_fe *)asStack_1360);
        secp256k1_gej_rescale(psVar39,(secp256k1_fe *)asStack_1360);
      }
      auStack_1660._0_4_ = uVar18;
      secp256k1_scalar_verify((secp256k1_scalar *)(ulong)uVar18);
      secp256k1_ecmult_gen
                (&psVar26->ecmult_gen_ctx,(secp256k1_gej *)asStack_1360,
                 (secp256k1_scalar *)auStack_1660);
      psVar23 = (secp256k1_context *)auStack_1960;
      secp256k1_ge_set_gej((secp256k1_ge *)psVar23,(secp256k1_gej *)asStack_1360);
      if (*(int *)(auStack_990 + lVar36 + 0x58) != 0) goto LAB_00117d39;
      if (iStack_1900 != 0) goto LAB_00117d3e;
      psVar23 = (secp256k1_context *)auStack_1960;
      iVar5 = secp256k1_fe_equal((secp256k1_fe *)psVar23,(secp256k1_fe *)(auStack_998 + lVar36));
      if (iVar5 == 0) goto LAB_00117d43;
      psVar23 = (secp256k1_context *)(auStack_1960 + 0x30);
      iVar5 = secp256k1_fe_equal((secp256k1_fe *)psVar23,
                                 (secp256k1_fe *)(auStack_990 + lVar36 + 0x28));
      if (iVar5 == 0) goto LAB_00117d48;
      uVar18 = uVar18 + 1;
      lVar36 = lVar36 + 0x68;
      psVar12 = psVar39;
    } while (lVar36 != 0);
    uVar9 = 0;
    puVar20 = auStack_ee0;
    lVar36 = 0;
    do {
      psVar23 = (secp256k1_context *)(puVar20 + (uVar9 / 0xd) * -0x548);
      secp256k1_ge_mul_lambda((secp256k1_ge *)asStack_1360,(secp256k1_ge *)(auStack_ee0 + lVar36));
      iVar5 = secp256k1_ge_eq_var((secp256k1_ge *)psVar23,(secp256k1_ge *)asStack_1360);
      if (iVar5 == 0) goto LAB_00117d4d;
      lVar36 = lVar36 + 0x68;
      puVar20 = puVar20 + 0x3a8;
      uVar9 = uVar9 + 9;
    } while (lVar36 != 0x548);
    psVar27 = (secp256k1_context *)auStack_ee0;
    secp256k1_ge_verify((secp256k1_ge *)psVar27);
    if (auStack_ee0._96_4_ == 0) goto LAB_00117d98;
    psVar27 = (secp256k1_context *)auStack_990;
    secp256k1_gej_verify((secp256k1_gej *)psVar27);
    if (auStack_990._144_4_ == 0) goto LAB_00117d9d;
    lVar36 = 0xc;
    psVar27 = (secp256k1_context *)(auStack_ee0 + 0x68);
    psVar28 = (secp256k1_context *)(auStack_990 + 0x98);
    do {
      psVar23 = psVar27;
      secp256k1_ge_verify((secp256k1_ge *)psVar27);
      if ((psVar27->ecmult_gen_ctx).ge_offset.y.magnitude != 0) goto LAB_00117d52;
      psVar23 = psVar28;
      secp256k1_gej_verify((secp256k1_gej *)psVar28);
      if ((int)(psVar28->ecmult_gen_ctx).proj_blind.n[4] != 0) goto LAB_00117d57;
      psVar28 = (secp256k1_context *)&(psVar28->ecmult_gen_ctx).proj_blind.magnitude;
      psVar27 = (secp256k1_context *)&(psVar27->ecmult_gen_ctx).ge_offset.infinity;
      lVar36 = lVar36 + -1;
    } while (lVar36 != 0);
    pFVar21 = (FILE *)auStack_ee0;
    psStack_1c40 = (secp256k1_gej *)0x0;
    uStack_1c30 = 0;
    do {
      if (((ulong)num_cores == 1) ||
         (uStack_1c30 = uStack_1c30 + 0xe7037ed1a0b428db,
         (uint32_t)((uStack_1c30 >> 0x20 ^ uStack_1c30 & 0xffffffff) * (ulong)num_cores >> 0x20) ==
         this_core)) {
        lVar36 = (long)psStack_1c40 * 0x98;
        secp256k1_fe_inv((secp256k1_fe *)auStack_1660,(secp256k1_fe *)(auStack_990 + lVar36 + 0x60))
        ;
        lVar31 = 0;
        __stream = pFVar21;
        psVar12 = psStack_1c40;
        do {
          psVar11 = (secp256k1_ge *)(((ulong)psVar12 / 0xd) * -0x548 + (long)__stream);
          psVar39 = (secp256k1_gej *)(auStack_990 + lVar31);
          secp256k1_gej_add_var
                    ((secp256k1_gej *)asStack_1360,psVar39,(secp256k1_gej *)(auStack_990 + lVar36),
                     (secp256k1_fe *)0x4ec4ec4ec4ec4ec5);
          iVar5 = secp256k1_gej_eq_ge_var((secp256k1_gej *)asStack_1360,psVar11);
          if (iVar5 == 0) goto LAB_00117cd8;
          if (psStack_1c40 != (secp256k1_gej *)0x0) {
            secp256k1_gej_add_ge
                      ((secp256k1_gej *)asStack_1360,psVar39,
                       (secp256k1_ge *)(auStack_ee0 + (long)psStack_1c40 * 0x68));
            iVar5 = secp256k1_gej_eq_ge_var((secp256k1_gej *)asStack_1360,psVar11);
            if (iVar5 == 0) {
              main_cold_8();
              goto LAB_00117d1d;
            }
          }
          secp256k1_gej_add_ge_var
                    ((secp256k1_gej *)asStack_1360,psVar39,
                     (secp256k1_ge *)(auStack_ee0 + (long)psStack_1c40 * 0x68),(secp256k1_fe *)0x0);
          iVar5 = secp256k1_gej_eq_ge_var((secp256k1_gej *)asStack_1360,psVar11);
          psStack_1c48 = psVar12;
          if (iVar5 == 0) goto LAB_00117cdd;
          iStack_1900 = *(int *)(auStack_990 + lVar36 + 0x90);
          auStack_1960._32_8_ = *(uint64_t *)(auStack_990 + lVar36 + 0x20);
          auStack_1960._40_7_ = (undefined7)*(undefined8 *)(auStack_990 + lVar36 + 0x28);
          auStack_1960[0x2f] = (uchar)((ulong)*(undefined8 *)(auStack_990 + lVar36 + 0x28) >> 0x38);
          auStack_1960._16_8_ = *(uint64_t *)(auStack_990 + lVar36 + 0x10);
          auStack_1960._24_7_ = (undefined7)*(undefined8 *)(auStack_990 + lVar36 + 0x18);
          auStack_1960[0x1f] = (uchar)((ulong)*(undefined8 *)(auStack_990 + lVar36 + 0x18) >> 0x38);
          auStack_1960._0_8_ = (((secp256k1_gej *)(auStack_990 + lVar36))->x).n[0];
          auStack_1960._8_7_ = (undefined7)*(undefined8 *)(auStack_990 + lVar36 + 8);
          auStack_1960[0xf] = (uchar)((ulong)*(undefined8 *)(auStack_990 + lVar36 + 8) >> 0x38);
          auStack_1960._48_8_ = *(undefined8 *)(auStack_990 + lVar36 + 0x30);
          auStack_1920 = *(undefined1 (*) [16])(auStack_990 + lVar36 + 0x40);
          uStack_1910 = *(uint64_t *)(auStack_990 + lVar36 + 0x50);
          uStack_1908 = *(uint64_t *)(auStack_990 + lVar36 + 0x58);
          auStack_1928._0_7_ = (undefined7)*(undefined8 *)(auStack_990 + lVar36 + 0x38);
          auStack_1928[7] = (uchar)((ulong)*(undefined8 *)(auStack_990 + lVar36 + 0x38) >> 0x38);
          secp256k1_gej_add_zinv_var
                    ((secp256k1_gej *)asStack_1360,psVar39,(secp256k1_ge *)auStack_1960,
                     (secp256k1_fe *)auStack_1660);
          iVar5 = secp256k1_gej_eq_ge_var((secp256k1_gej *)asStack_1360,psVar11);
          if (iVar5 == 0) goto LAB_00117ce2;
          lVar31 = lVar31 + 0x98;
          __stream = (FILE *)&__stream->_chain;
          psVar12 = (secp256k1_gej *)((long)(psVar12->x).n + 1);
        } while (lVar31 != 0x7b8);
      }
      psStack_1c40 = (secp256k1_gej *)((long)(psStack_1c40->x).n + 1);
      pFVar21 = (FILE *)&pFVar21->_chain;
    } while (psStack_1c40 != (secp256k1_gej *)0xd);
    psVar12 = (secp256k1_gej *)auStack_990;
    uVar18 = 0;
    uVar9 = 0;
    do {
      secp256k1_gej_double((secp256k1_gej *)asStack_1360,psVar12);
      uVar33 = uVar18 - 0xd;
      if (uVar9 < 7) {
        uVar33 = uVar18;
      }
      psVar23 = asStack_1360;
      iVar5 = secp256k1_gej_eq_ge_var
                        ((secp256k1_gej *)asStack_1360,
                         (secp256k1_ge *)(auStack_ee0 + (ulong)uVar33 * 0x68));
      if (iVar5 == 0) goto LAB_00117d5c;
      secp256k1_gej_double_var((secp256k1_gej *)asStack_1360,psVar12,(secp256k1_fe *)0x0);
      psVar23 = asStack_1360;
      iVar5 = secp256k1_gej_eq_ge_var
                        ((secp256k1_gej *)asStack_1360,
                         (secp256k1_ge *)(auStack_ee0 + (ulong)uVar33 * 0x68));
      if (iVar5 == 0) goto LAB_00117d61;
      uVar9 = uVar9 + 1;
      uVar18 = uVar18 + 2;
      psVar12 = psVar12 + 1;
    } while (uVar9 != 0xd);
    lVar36 = 0x68;
    psVar11 = &sStack_a00;
    psVar12 = (secp256k1_gej *)(auStack_990 + 0x98);
    do {
      psVar23 = (secp256k1_context *)auStack_1960;
      secp256k1_ge_neg((secp256k1_ge *)psVar23,(secp256k1_ge *)(auStack_ee0 + lVar36));
      iVar5 = secp256k1_ge_eq_var((secp256k1_ge *)psVar23,psVar11);
      if (iVar5 == 0) goto LAB_00117d66;
      secp256k1_gej_neg((secp256k1_gej *)asStack_1360,psVar12);
      psVar23 = asStack_1360;
      iVar5 = secp256k1_gej_eq_ge_var((secp256k1_gej *)asStack_1360,psVar11);
      if (iVar5 == 0) goto LAB_00117d6b;
      lVar36 = lVar36 + 0x68;
      psVar12 = psVar12 + 1;
      psVar11 = psVar11 + -1;
    } while (lVar36 != 0x548);
    lVar36 = 1;
    lStack_1c28 = 0x68;
    uStack_1c30 = 0;
    do {
      psStack_1c48 = (secp256k1_gej *)0x0;
      pFVar21 = (FILE *)auStack_ee0;
      do {
        if (((ulong)num_cores == 1) ||
           (uStack_1c30 = uStack_1c30 + 0xe7037ed1a0b428db,
           (uint32_t)((uStack_1c30 >> 0x20 ^ uStack_1c30 & 0xffffffff) * (ulong)num_cores >> 0x20)
           == this_core)) {
          psVar32 = (secp256k1_scalar *)0x0;
          __stream = pFVar21;
          psVar12 = psStack_1c48;
          do {
            auStack_1b90._0_4_ = (int)psVar32;
            secp256k1_scalar_verify(psVar32);
            auStack_1bc0._0_4_ = (int)psStack_1c48;
            secp256k1_scalar_verify((secp256k1_scalar *)psStack_1c48);
            auStack_1c00._8_8_ = auStack_1960;
            auStack_1c00._0_8_ = auStack_1660;
            auStack_1bf0._0_8_ = asStack_1360;
            secp256k1_ecmult_strauss_wnaf
                      ((secp256k1_strauss_state *)auStack_1c00,(secp256k1_gej *)auStack_1b00,1,
                       (secp256k1_gej *)(auStack_990 + lVar36 * 0x98),
                       (secp256k1_scalar *)auStack_1b90,(secp256k1_scalar *)auStack_1bc0);
            iVar5 = secp256k1_gej_eq_ge_var
                              ((secp256k1_gej *)auStack_1b00,
                               (secp256k1_ge *)(((ulong)psVar12 / 0xd) * -0x548 + (long)__stream));
            if (iVar5 == 0) {
              main_cold_48();
              goto LAB_00117cd8;
            }
            uVar18 = (int)psVar32 + 1;
            psVar32 = (secp256k1_scalar *)(ulong)uVar18;
            __stream = (FILE *)((long)&__stream->_flags + lStack_1c28);
            psVar12 = (secp256k1_gej *)((long)(psVar12->x).n + lVar36);
          } while (uVar18 != 0xd);
        }
        psStack_1c48 = (secp256k1_gej *)((long)(psStack_1c48->x).n + 1);
        pFVar21 = (FILE *)&pFVar21->_chain;
      } while ((int)psStack_1c48 != 0xd);
      lVar36 = lVar36 + 1;
      lStack_1c28 = lStack_1c28 + 0x68;
    } while (lVar36 != 0xd);
    uVar9 = 0;
    do {
      lVar36 = 0;
      do {
        psVar28 = (secp256k1_context *)auStack_1b00;
        if (((ulong)num_cores == 1) ||
           (uStack_1c30 = uStack_1c30 + 0xe7037ed1a0b428db,
           (uint32_t)((uStack_1c30 >> 0x20 ^ uStack_1c30 & 0xffffffff) * (ulong)num_cores >> 0x20)
           == this_core)) {
          auStack_1c00._0_4_ = (int)uVar9;
          secp256k1_scalar_verify((secp256k1_scalar *)(uVar9 & 0xffffffff));
          psVar11 = (secp256k1_ge *)(auStack_ee0 + lVar36 * 0x68);
          secp256k1_ecmult_const
                    ((secp256k1_gej *)asStack_1360,psVar11,(secp256k1_scalar *)auStack_1c00);
          uVar18 = (int)lVar36 * (int)uVar9;
          b = (secp256k1_ge *)
              (auStack_ee0 + (ulong)(uVar18 - (uVar18 / 0xd + (uVar18 / 0xd) * 0xc)) * 0x68);
          psVar23 = asStack_1360;
          iVar5 = secp256k1_gej_eq_ge_var((secp256k1_gej *)asStack_1360,b);
          if (iVar5 == 0) goto LAB_00117d75;
          if (lVar36 != 0 && uVar9 != 0) {
            psVar23 = psVar28;
            iVar5 = secp256k1_ecmult_const_xonly
                              ((secp256k1_fe *)psVar28,(secp256k1_fe *)psVar11,(secp256k1_fe *)0x0,
                               (secp256k1_scalar *)auStack_1c00,0);
            if (iVar5 == 0) goto LAB_00117d7f;
            iVar5 = secp256k1_fe_equal((secp256k1_fe *)psVar28,(secp256k1_fe *)b);
            if (iVar5 == 0) goto LAB_00117d84;
            do {
              psVar23 = (secp256k1_context *)auStack_1660;
              testutil_random_fe((secp256k1_fe *)psVar23);
              secp256k1_fe_verify((secp256k1_fe *)psVar23);
              if (iStack_1634 == 0) goto LAB_00117d34;
            } while ((SUB168((undefined1  [16])sStack_1650 | auStack_1660,8) == 0 &&
                     SUB168((undefined1  [16])sStack_1650 | auStack_1660,0) == 0) &&
                     uStack_1640 == 0);
            secp256k1_fe_mul((secp256k1_fe *)auStack_1960,(secp256k1_fe *)auStack_1660,
                             (secp256k1_fe *)psVar11);
            psVar27 = (secp256k1_context *)auStack_1b00;
            psVar28 = psVar27;
            iVar5 = secp256k1_ecmult_const_xonly
                              ((secp256k1_fe *)psVar27,(secp256k1_fe *)auStack_1960,
                               (secp256k1_fe *)auStack_1660,(secp256k1_scalar *)auStack_1c00,0);
            if (iVar5 == 0) goto LAB_00117d89;
            iVar5 = secp256k1_fe_equal((secp256k1_fe *)psVar27,(secp256k1_fe *)b);
            if (iVar5 == 0) goto LAB_00117d8e;
          }
        }
        lVar36 = lVar36 + 1;
      } while (lVar36 != 0xd);
      uVar9 = uVar9 + 1;
    } while (uVar9 != 0xd);
    psVar27 = (secp256k1_context *)malloc(0x1020);
    if (psVar27 == (secp256k1_context *)0x0) {
      (*(psVar26->error_callback).fn)("Out of memory",(psVar26->error_callback).data);
    }
    else {
      (psVar27->ecmult_gen_ctx).ge_offset.x.n[1] = 0;
      (psVar27->ecmult_gen_ctx).built = 0x61726373;
      (psVar27->ecmult_gen_ctx).scalar_offset = 0x686374;
      (psVar27->ecmult_gen_ctx).ge_offset.x.n[0] =
           (uint64_t)((psVar27->ecmult_gen_ctx).ge_offset.x.n + 3);
      (psVar27->ecmult_gen_ctx).ge_offset.x.n[2] = 0x1000;
    }
    psStack_1c10 = (secp256k1_context *)&psStack_1c10->error_callback;
    p_Stack_1b60 = (_func_void_char_ptr_void_ptr *)0x0;
    psStack_1c40 = (secp256k1_gej *)0x0;
    pvStack_1b58 = (void *)0x0;
    do {
      uStack_1c30 = 0;
      uVar9 = 0;
      do {
        puVar20 = auStack_ee0;
        uVar17 = 0;
        do {
          lVar36 = 0;
          uVar29 = uVar17;
          puStack_1b30 = puVar20;
          do {
            if (((ulong)num_cores == 1) ||
               (pvStack_1b58 = (void *)((long)pvStack_1b58 + 0xe7037ed1a0b428db), puVar22 = puVar20,
               lVar31 = lVar36, uVar40 = uVar29,
               (uint32_t)
               (((ulong)pvStack_1b58 >> 0x20 ^ (ulong)pvStack_1b58 & 0xffffffff) * (ulong)num_cores
               >> 0x20) == this_core)) {
              lVar37 = 0;
              uStack_1c08 = uVar29;
              lStack_1b28 = lVar36;
              puStack_1b20 = puVar20;
              do {
                asStack_1360[0].ecmult_gen_ctx.built = (int)psStack_1c40;
                secp256k1_scalar_verify((secp256k1_scalar *)psStack_1c40);
                asStack_1360[0].ecmult_gen_ctx.scalar_offset = (int)uVar9;
                secp256k1_scalar_verify((secp256k1_scalar *)(uVar9 & 0xffffffff));
                auStack_1660._0_4_ = (int)uVar17;
                secp256k1_scalar_verify((secp256k1_scalar *)(uVar17 & 0xffffffff));
                puVar24 = (uint64_t *)(auStack_ee0 + lVar36 * 0x68);
                psVar11 = &asStack_1360[0].ecmult_gen_ctx.ge_offset;
                for (lVar31 = 0xd; lVar31 != 0; lVar31 = lVar31 + -1) {
                  (psVar11->x).n[0] = *puVar24;
                  puVar24 = puVar24 + (ulong)bVar43 * -2 + 1;
                  psVar11 = (secp256k1_ge *)((long)psVar11 + ((ulong)bVar43 * -2 + 1) * 8);
                }
                puVar24 = (uint64_t *)(auStack_ee0 + lVar37);
                psVar15 = &asStack_1360[0].ecmult_gen_ctx.proj_blind;
                for (lVar31 = 0xd; lVar31 != 0; lVar31 = lVar31 + -1) {
                  psVar15->n[0] = *puVar24;
                  puVar24 = puVar24 + (ulong)bVar43 * -2 + 1;
                  psVar15 = (secp256k1_fe *)((long)psVar15 + ((ulong)bVar43 * -2 + 1) * 8);
                }
                psVar23 = (secp256k1_context *)auStack_1960;
                secp256k1_ecmult_multi_var
                          ((secp256k1_callback *)psStack_1c10,(secp256k1_scratch *)psVar27,
                           (secp256k1_gej *)psVar23,(secp256k1_scalar *)auStack_1660,
                           ecmult_multi_callback,asStack_1360,2);
                iVar5 = secp256k1_gej_eq_ge_var
                                  ((secp256k1_gej *)psVar23,
                                   (secp256k1_ge *)(puVar20 + (uVar29 / 0xd) * -0x548));
                if (iVar5 == 0) goto LAB_00117d70;
                lVar37 = lVar37 + 0x68;
                puVar20 = puVar20 + uStack_1c30;
                uVar29 = uVar29 + uVar9;
                puVar22 = puStack_1b20;
                lVar31 = lStack_1b28;
                uVar40 = uStack_1c08;
              } while (lVar37 != 0x548);
            }
            lVar36 = lVar31 + 1;
            puVar20 = puVar22 + (long)p_Stack_1b60;
            uVar29 = uVar40 + (long)psStack_1c40;
          } while (lVar36 != 0xd);
          uVar17 = uVar17 + 1;
          puVar20 = puStack_1b30 + 0x68;
        } while (uVar17 != 0xd);
        uVar9 = uVar9 + 1;
        uStack_1c30 = uStack_1c30 + 0x68;
      } while (uVar9 != 0xd);
      psStack_1c40 = (secp256k1_gej *)((long)psStack_1c40 + 1);
      p_Stack_1b60 = p_Stack_1b60 + 0x68;
    } while (psStack_1c40 != (secp256k1_gej *)0xd);
    if (psVar27 != (secp256k1_context *)0x0) {
      lVar36 = 0;
      do {
        if (*(char *)((long)(psVar27->ecmult_gen_ctx).ge_offset.x.n + lVar36 + -8) !=
            "scratch"[lVar36]) {
          (*(psVar26->error_callback).fn)("invalid scratch space",(psVar26->error_callback).data);
          goto LAB_00116e12;
        }
        lVar36 = lVar36 + 1;
      } while (lVar36 != 8);
      if ((psVar27->ecmult_gen_ctx).ge_offset.x.n[1] != 0) goto LAB_00117dc5;
      free(psVar27);
    }
LAB_00116e12:
    uVar18 = 1;
    uVar9 = 0;
    do {
      psVar32 = (secp256k1_scalar *)0x1;
      do {
        if (((ulong)num_cores == 1) ||
           (uVar9 = uVar9 + 0xe7037ed1a0b428db,
           (uint32_t)((uVar9 >> 0x20 ^ uVar9 & 0xffffffff) * (ulong)num_cores >> 0x20) == this_core)
           ) {
          auStack_1b00._0_4_ = 1;
          iVar5 = 1;
          do {
            secp256k1_scalar_verify((secp256k1_scalar *)(ulong)uVar18);
            secp256k1_scalar_verify(psVar32);
            secp256k1_scalar_verify(psVar32);
            auStack_1960._16_8_ = 0;
            auStack_1960[0x18] = '\0';
            auStack_1960[0x19] = '\0';
            auStack_1960[0x1a] = '\0';
            auStack_1960[0x1b] = '\0';
            auStack_1960[0x1c] = '\0';
            auStack_1960[0x1d] = '\0';
            auStack_1960[0x1e] = '\0';
            auStack_1960._0_8_ = 0;
            auStack_1960[8] = '\0';
            auStack_1960[9] = '\0';
            auStack_1960[10] = '\0';
            auStack_1960[0xb] = '\0';
            auStack_1960[0xc] = '\0';
            auStack_1960[0xd] = '\0';
            auStack_1960[0xe] = '\0';
            auStack_1960[0xf] = '\0';
            auStack_1960[0x1f] = (uchar)psVar32;
            secp256k1_scalar_verify((secp256k1_scalar *)(ulong)uVar18);
            auStack_1660 = (undefined1  [16])0x0;
            sStack_1650._0_15_ = SUB1615((undefined1  [16])0x0,0);
            sStack_1650.data._7_1_ = (char)uVar18;
            psVar27 = psVar26;
            iVar6 = secp256k1_ecdsa_sign
                              (psVar26,(secp256k1_ecdsa_signature *)asStack_1360,auStack_1660,
                               auStack_1960,secp256k1_nonce_function_smallint,auStack_1b00);
            if (iVar6 != 1) goto LAB_00117db1;
            lVar36 = 0;
            uVar33 = 0;
            do {
              uVar13 = (uint)*(byte *)((long)asStack_1360[0].ecmult_gen_ctx.ge_offset.x.n +
                                      lVar36 + -8) | uVar33 << 8;
              uVar33 = uVar13 - (uVar13 / 0xd + (uVar13 / 0xd) * 0xc);
              if (uVar13 < 0xd) {
                uVar33 = uVar13;
              }
              lVar36 = lVar36 + 1;
            } while (lVar36 != 0x20);
            secp256k1_scalar_verify((secp256k1_scalar *)(ulong)uVar33);
            uVar13 = 0;
            lVar36 = 0x20;
            do {
              uVar14 = (uint)*(byte *)((long)asStack_1360[0].ecmult_gen_ctx.ge_offset.x.n +
                                      lVar36 + -8) | uVar13 << 8;
              piVar16 = (int *)(ulong)uVar14;
              uVar13 = uVar14 - (uVar14 / 0xd + (uVar14 / 0xd) * 0xc);
              if (uVar14 < 0xd) {
                uVar13 = uVar14;
              }
              lVar36 = lVar36 + 1;
            } while (lVar36 != 0x40);
            secp256k1_scalar_verify((secp256k1_scalar *)(ulong)uVar13);
            psVar27 = (secp256k1_context *)auStack_1c00;
            r_from_k((secp256k1_scalar *)psVar27,(secp256k1_ge *)auStack_ee0,auStack_1b00._0_4_,
                     piVar16);
            if (uVar33 != auStack_1c00._0_4_) goto LAB_00117db6;
            uVar4 = auStack_1b00._0_4_;
            uVar14 = auStack_1b00._0_4_ * uVar13;
            uVar33 = uVar33 * (int)psVar32 + uVar18;
            iVar6 = uVar33 - (uVar33 / 0xd + (uVar33 / 0xd) * 0xc);
            if ((uVar14 - (uVar14 / 0xd + (uVar14 / 0xd) * 0xc) != iVar6) &&
               (uVar33 = (0xd - uVar13) * auStack_1b00._0_4_,
               uVar33 - (uVar33 / 0xd + (uVar33 / 0xd) * 0xc) != iVar6)) goto LAB_00117dbb;
            if ((int)auStack_1b00._0_4_ < iVar5) break;
            iVar5 = auStack_1b00._0_4_ + 1;
            auStack_1b00._0_4_ = iVar5;
          } while ((int)uVar4 < 0xc);
        }
        uVar33 = (int)psVar32 + 1;
        psVar32 = (secp256k1_scalar *)(ulong)uVar33;
      } while (uVar33 != 0xd);
      uVar18 = uVar18 + 1;
    } while (uVar18 != 0xd);
    uVar18 = 1;
    uStack_1c30 = 0;
    uVar7 = num_cores;
    do {
      psStack_1c48 = (secp256k1_gej *)0x1;
      do {
        uVar33 = 1;
        do {
          psStack_1c40 = (secp256k1_gej *)0x1;
          do {
            if ((uVar7 == 1) ||
               (uStack_1c30 = uStack_1c30 + 0xe7037ed1a0b428db,
               (uint32_t)((ulong)uVar7 * (uStack_1c30 >> 0x20 ^ uStack_1c30 & 0xffffffff) >> 0x20)
               == this_core)) {
              secp256k1_scalar_verify((secp256k1_scalar *)(ulong)uVar18);
              secp256k1_scalar_verify((secp256k1_scalar *)((ulong)psStack_1c48 & 0xffffffff));
              auStack_1c00._0_4_ = uVar33;
              secp256k1_scalar_verify((secp256k1_scalar *)(ulong)uVar33);
              secp256k1_scalar_verify((secp256k1_scalar *)((ulong)psStack_1c40 & 0xffffffff));
              uVar14 = (int)psStack_1c48 * (int)psStack_1c40;
              piVar16 = (int *)(ulong)((uVar14 / 0xd) * 3);
              uVar14 = uVar14 - (uVar14 / 0xd + (uVar14 / 0xd) * 0xc);
              uVar9 = 0;
              uVar13 = 0;
              psVar32 = (secp256k1_scalar *)0x0;
              do {
                r_from_k((secp256k1_scalar *)asStack_1360,(secp256k1_ge *)auStack_ee0,(int)psVar32,
                         piVar16);
                if (psStack_1c48 ==
                    (secp256k1_gej *)(asStack_1360[0].ecmult_gen_ctx._0_8_ & 0xffffffff)) {
                  iVar5 = (int)(uVar9 / 0xd);
                  piVar16 = (int *)(ulong)(uint)(iVar5 * 3);
                  uVar34 = (int)uVar9 - ((int)(uVar9 / 0xd) + iVar5 * 0xc);
                  secp256k1_scalar_verify(psVar32);
                  secp256k1_scalar_verify(psVar32);
                  secp256k1_scalar_verify((secp256k1_scalar *)(ulong)uVar18);
                  secp256k1_scalar_verify((secp256k1_scalar *)(ulong)uVar34);
                  secp256k1_scalar_verify((secp256k1_scalar *)psStack_1c48);
                  secp256k1_scalar_verify((secp256k1_scalar *)psStack_1c40);
                  auStack_1b90._0_4_ = uVar14;
                  secp256k1_scalar_verify((secp256k1_scalar *)(ulong)uVar14);
                  secp256k1_scalar_add
                            ((secp256k1_scalar *)auStack_1b90,(secp256k1_scalar *)auStack_1b90,
                             (secp256k1_scalar *)auStack_1c00);
                  secp256k1_scalar_verify((secp256k1_scalar *)(ulong)uVar34);
                  uVar4 = auStack_1b90._0_4_;
                  secp256k1_scalar_verify((secp256k1_scalar *)(auStack_1b90._0_8_ & 0xffffffff));
                  uVar13 = uVar13 | uVar34 == uVar4;
                }
                uVar34 = (int)psVar32 + 1;
                psVar32 = (secp256k1_scalar *)(ulong)uVar34;
                uVar9 = (ulong)((int)uVar9 + uVar18);
              } while (uVar34 != 0xd);
              secp256k1_scalar_verify((secp256k1_scalar *)(ulong)uVar18);
              secp256k1_scalar_verify((secp256k1_scalar *)((ulong)psStack_1c48 & 0xffffffff));
              auStack_1960._16_8_ = 0;
              auStack_1960[0x18] = '\0';
              auStack_1960[0x19] = '\0';
              auStack_1960[0x1a] = '\0';
              auStack_1960[0x1b] = '\0';
              auStack_1960[0x1c] = '\0';
              auStack_1960[0x1d] = '\0';
              auStack_1960[0x1e] = '\0';
              auStack_1960._0_8_ = 0;
              auStack_1960[8] = '\0';
              auStack_1960[9] = '\0';
              auStack_1960[10] = '\0';
              auStack_1960[0xb] = '\0';
              auStack_1960[0xc] = '\0';
              auStack_1960[0xd] = '\0';
              auStack_1960[0xe] = '\0';
              auStack_1960[0xf] = '\0';
              auStack_1960[0x1f] = (uchar)psStack_1c48;
              secp256k1_scalar_verify((secp256k1_scalar *)(ulong)uVar18);
              auStack_1960._48_8_ = 0;
              auStack_1928[0] = '\0';
              auStack_1928[1] = '\0';
              auStack_1928[2] = '\0';
              auStack_1928[3] = '\0';
              auStack_1928[4] = '\0';
              auStack_1928[5] = '\0';
              auStack_1928[6] = '\0';
              auStack_1960._32_8_ = 0;
              auStack_1960._40_7_ = 0;
              auStack_1960[0x2f] = '\0';
              auStack_1928[7] = (uchar)uVar18;
              puVar25 = (undefined8 *)(auStack_ee0 + (long)psStack_1c40 * 0x68);
              psVar27 = asStack_1360;
              for (lVar36 = 0xd; lVar36 != 0; lVar36 = lVar36 + -1) {
                uVar2 = *puVar25;
                (psVar27->ecmult_gen_ctx).built = (int)uVar2;
                (psVar27->ecmult_gen_ctx).scalar_offset = (int)((ulong)uVar2 >> 0x20);
                puVar25 = puVar25 + (ulong)bVar43 * -2 + 1;
                psVar27 = (secp256k1_context *)((long)psVar27 + (ulong)bVar43 * -0x10 + 8);
              }
              secp256k1_ge_to_bytes((uchar *)auStack_1660,(secp256k1_ge *)asStack_1360);
              secp256k1_scalar_verify((secp256k1_scalar *)(ulong)uVar33);
              auStack_1b00 = (undefined1  [16])0x0;
              sStack_1af0._0_15_ = SUB1615((undefined1  [16])0x0,0);
              sStack_1af0.data._7_1_ = (char)uVar33;
              psVar27 = psVar26;
              uVar14 = secp256k1_ecdsa_verify
                                 (psVar26,(secp256k1_ecdsa_signature *)auStack_1960,auStack_1b00,
                                  (secp256k1_pubkey *)auStack_1660);
              uVar7 = num_cores;
              if ((uVar18 < 7 & uVar13) != uVar14) goto LAB_00117dc0;
            }
            psStack_1c40 = (secp256k1_gej *)((long)psStack_1c40 + 1);
          } while (psStack_1c40 != (secp256k1_gej *)0xd);
          uVar33 = uVar33 + 1;
        } while (uVar33 != 0xd);
        psStack_1c48 = (secp256k1_gej *)((long)psStack_1c48 + 1);
      } while (psStack_1c48 != (secp256k1_gej *)0xd);
      uVar18 = uVar18 + 1;
    } while (uVar18 != 0xd);
    psStack_1c48 = (secp256k1_gej *)0x1;
    puVar20 = auStack_19a0;
    puVar22 = auStack_1b00;
    do {
      secp256k1_scalar_verify((secp256k1_scalar *)((ulong)psStack_1c48 & 0xffffffff));
      secp256k1_scalar_verify((secp256k1_scalar *)((ulong)psStack_1c48 & 0xffffffff));
      auStack_1bc0 = (undefined1  [16])0x0;
      sStack_1bb0._0_15_ = SUB1615((undefined1  [16])0x0,0);
      sStack_1bb0.data._7_1_ = (char)psStack_1c48;
      lVar36 = (long)psStack_1c48 - 1;
      keypair = (secp256k1_keypair *)
                ((long)(&asStack_1360[0].ecmult_gen_ctx.ge_offset + -1) + (long)psStack_1c48 * 0x60)
      ;
      psVar27 = psVar26;
      iVar5 = secp256k1_keypair_create(psVar26,keypair,auStack_1bc0);
      if (iVar5 == 0) goto LAB_00117dca;
      psVar27 = psVar26;
      iVar5 = secp256k1_ec_pubkey_create
                        (psVar26,(secp256k1_pubkey *)(auStack_1960 + lVar36 * 0x40),auStack_1bc0);
      if (iVar5 == 0) goto LAB_00117dcf;
      psVar41 = (secp256k1_xonly_pubkey *)(auStack_1660 + lVar36 * 0x40);
      pk_parity = (uint *)(auStack_1c00 + lVar36 * 4);
      psVar27 = psVar26;
      iVar5 = secp256k1_keypair_xonly_pub(psVar26,psVar41,(int *)pk_parity,keypair);
      if (iVar5 == 0) goto LAB_00117dd4;
      puVar38 = auStack_1b00 + lVar36 * 0x20;
      psVar27 = psVar26;
      iVar5 = secp256k1_xonly_pubkey_serialize(psVar26,puVar38,psVar41);
      if (iVar5 == 0) goto LAB_00117dd9;
      psVar27 = psVar26;
      iVar5 = secp256k1_xonly_pubkey_parse(psVar26,psVar41,puVar38);
      if (iVar5 == 0) goto LAB_00117dde;
      psVar27 = psVar26;
      iVar5 = secp256k1_xonly_pubkey_serialize(psVar26,auStack_1bc0,psVar41);
      if (iVar5 == 0) goto LAB_00117de3;
      lVar31 = 0;
      do {
        if (puVar22[lVar31] != auStack_1bc0[lVar31]) goto LAB_00117de8;
        lVar31 = lVar31 + 1;
      } while (lVar31 != 0x20);
      psVar27 = psVar26;
      iVar5 = secp256k1_xonly_pubkey_from_pubkey
                        (psVar26,psVar41,(int *)&sStack_1b50,
                         (secp256k1_pubkey *)(auStack_1960 + lVar36 * 0x40));
      if (iVar5 == 0) goto LAB_00117ded;
      if ((uint)sStack_1b50.fn != *pk_parity) goto LAB_00117df2;
      psVar27 = psVar26;
      iVar5 = secp256k1_xonly_pubkey_serialize(psVar26,auStack_1bc0,psVar41);
      if (iVar5 == 0) goto LAB_00117df7;
      lVar36 = 0;
      do {
        if (puVar22[lVar36] != auStack_1bc0[lVar36]) goto LAB_00117dfc;
        lVar36 = lVar36 + 1;
      } while (lVar36 != 0x20);
      psVar27 = (secp256k1_context *)auStack_1b90;
      secp256k1_fe_impl_set_b32_mod((secp256k1_fe *)psVar27,puVar38);
      auStack_1b90._40_8_ = 1;
      secp256k1_fe_verify((secp256k1_fe *)psVar27);
      lVar36 = (long)psStack_1c48 * 0x68;
      iVar5 = secp256k1_fe_equal((secp256k1_fe *)psVar27,(secp256k1_fe *)(auStack_ee0 + lVar36));
      if (iVar5 == 0) goto LAB_00117e01;
      auStack_1b90._0_8_ = *(undefined8 *)(auStack_ee0 + lVar36 + 0x30);
      auStack_1b90._8_8_ = *(undefined8 *)(auStack_ee0 + lVar36 + 0x38);
      auStack_1b90._16_8_ = *(undefined8 *)(auStack_ee0 + lVar36 + 0x40);
      auStack_1b90._24_8_ = *(undefined8 *)(auStack_ee0 + lVar36 + 0x48);
      auStack_1b90._32_8_ = *(undefined8 *)(auStack_ee0 + lVar36 + 0x50);
      auStack_1b90._40_8_ = *(undefined8 *)(auStack_ee0 + lVar36 + 0x58);
      psVar27 = (secp256k1_context *)auStack_1b90;
      secp256k1_fe_normalize_var((secp256k1_fe *)psVar27);
      secp256k1_fe_verify((secp256k1_fe *)psVar27);
      if (auStack_1b90._44_4_ == 0) goto LAB_00117e06;
      if ((auStack_1b90._0_4_ & 1) != *pk_parity) goto LAB_00117e0b;
      if (6 < psStack_1c48) {
        lVar36 = 0;
        do {
          if (puVar22[lVar36] != puVar20[lVar36]) goto LAB_00117e10;
          lVar36 = lVar36 + 1;
        } while (lVar36 != 0x20);
        if ((auStack_1b90._0_4_ & 1) != 1U - *(int *)(auStack_1c00 + (0xc - (long)psStack_1c48) * 4)
           ) goto LAB_00117e15;
      }
      psStack_1c48 = (secp256k1_gej *)((long)psStack_1c48 + 1);
      puVar22 = puVar22 + 0x20;
      puVar20 = puVar20 + -0x20;
    } while (psStack_1c48 != (secp256k1_gej *)0xd);
    lVar36 = 0;
    do {
      psVar27 = psVar26;
      iVar5 = secp256k1_xonly_pubkey_parse
                        (psVar26,(secp256k1_xonly_pubkey *)asStack_1360,
                         invalid_pubkey_bytes[0] + lVar36);
      if (iVar5 != 0) goto LAB_00117e1a;
      lVar36 = lVar36 + 0x20;
    } while (lVar36 != 0xe0);
    uVar18 = 1;
    psVar23 = asStack_1360;
    psVar41 = (secp256k1_xonly_pubkey *)auStack_1960;
    puVar38 = auStack_1660;
    lVar36 = 0;
    do {
      secp256k1_scalar_verify((secp256k1_scalar *)(ulong)uVar18);
      secp256k1_scalar_verify((secp256k1_scalar *)(ulong)uVar18);
      auStack_1b00 = (undefined1  [16])0x0;
      sStack_1af0._0_15_ = SUB1615((undefined1  [16])0x0,0);
      sStack_1af0.data._7_1_ = (char)uVar18;
      psVar27 = psVar26;
      iVar5 = secp256k1_keypair_create(psVar26,(secp256k1_keypair *)psVar23,auStack_1b00);
      if (iVar5 == 0) goto LAB_00117e1f;
      psVar27 = psVar26;
      iVar5 = secp256k1_keypair_xonly_pub
                        (psVar26,psVar41,(int *)(auStack_1b90 + lVar36),(secp256k1_keypair *)psVar23
                        );
      if (iVar5 == 0) goto LAB_00117e24;
      psVar27 = psVar26;
      iVar5 = secp256k1_xonly_pubkey_serialize(psVar26,puVar38,psVar41);
      if (iVar5 == 0) goto LAB_00117e29;
      lVar36 = lVar36 + 4;
      puVar38 = puVar38 + 0x20;
      psVar41 = psVar41 + 1;
      psVar23 = (secp256k1_context *)&(psVar23->ecmult_gen_ctx).ge_offset.y.magnitude;
      uVar18 = uVar18 + 1;
    } while (lVar36 != 0x30);
    sStack_1b18.magic[0] = 0xda;
    sStack_1b18.magic[1] = 'o';
    sStack_1b18.magic[2] = 0xb3;
    sStack_1b18.magic[3] = 0x8c;
    sStack_1b18._4_4_ = 0;
    lStack_1c28 = 1;
    uVar9 = 0;
    do {
      iVar5 = 0xd - (int)lStack_1c28;
      if ((&iStack_1b94)[lStack_1c28] == 0) {
        iVar5 = (int)lStack_1c28;
      }
      iStack_1c14 = 1;
      do {
        auStack_1be0 = (undefined1  [16])0x0;
        auStack_1bf0 = (undefined1  [16])0x0;
        auStack_1c00 = (undefined1  [16])0x0;
        iStack_1bd0 = 0;
        if (((ulong)num_cores == 1) ||
           (uVar9 = uVar9 + 0xe7037ed1a0b428db,
           (uint32_t)((uVar9 >> 0x20 ^ uVar9 & 0xffffffff) * (ulong)num_cores >> 0x20) == this_core)
           ) {
          sStack_1b18.noncefp = secp256k1_hardened_nonce_function_smallint;
          sStack_1b18.ndata = &iStack_1c14;
          iVar6 = 0xd - iStack_1c14;
          if ((&iStack_1b94)[iStack_1c14] == 0) {
            iVar6 = iStack_1c14;
          }
          iVar35 = 0;
          do {
            testrand256(auStack_1bc0);
            secp256k1_schnorrsig_challenge
                      (&uStack_1bc4,auStack_1680 + (long)iStack_1c14 * 0x20,auStack_1bc0,0x20,
                       auStack_1660 + (lStack_1c28 + -1) * 0x20);
            uVar17 = (ulong)uStack_1bc4;
            if (*(int *)(auStack_1c00 + uVar17 * 4) == 0) {
              uVar18 = uStack_1bc4 * iVar5 + iVar6;
              uVar18 = uVar18 - (uVar18 / 0xd + (uVar18 / 0xd) * 0xc);
              secp256k1_scalar_verify((secp256k1_scalar *)(ulong)uVar18);
              sStack_1b50.fn = (_func_void_char_ptr_void_ptr *)0x0;
              sStack_1b50.data = (void *)0x0;
              auStack_1b40._0_15_ = SUB1615((undefined1  [16])0x0,0);
              auStack_1b40[0xf] = (char)uVar18;
              psVar27 = psVar26;
              iVar8 = secp256k1_schnorrsig_sign_custom
                                (psVar26,auStack_1b00,auStack_1bc0,0x20,
                                 (secp256k1_keypair *)
                                 ((long)(&asStack_1360[0].ecmult_gen_ctx.ge_offset + -1) +
                                 lStack_1c28 * 0x60),&sStack_1b18);
              if (iVar8 == 0) goto LAB_00117e2e;
              lVar36 = 0;
              do {
                if (auStack_1b00[lVar36] != auStack_1680[lVar36 + (long)iStack_1c14 * 0x20])
                goto LAB_00117e33;
                lVar36 = lVar36 + 1;
              } while (lVar36 != 0x20);
              lVar36 = 0;
              do {
                if (*(char *)((long)&sStack_1ae0.fn + lVar36) !=
                    *(char *)((long)&sStack_1b50.fn + lVar36)) goto LAB_00117e38;
                lVar36 = lVar36 + 1;
              } while (lVar36 != 0x20);
              *(undefined4 *)(auStack_1c00 + uVar17 * 4) = 1;
              iVar35 = iVar35 + 1;
            }
          } while (iVar35 < 0xd);
        }
        iVar6 = iStack_1c14 + 1;
        bVar42 = iStack_1c14 < 0xc;
        iStack_1c14 = iVar6;
      } while (bVar42);
      lStack_1c28 = lStack_1c28 + 1;
    } while (lStack_1c28 != 0xd);
    uStack_1c08 = 1;
    psStack_1c10 = (secp256k1_context *)0x0;
    do {
      lVar36 = uStack_1c08 - 1;
      sStack_1bb0 = (&sStack_1650)[lVar36 * 2];
      iVar5 = 0xd - (int)uStack_1c08;
      if ((&iStack_1b94)[uStack_1c08] == 0) {
        iVar5 = (int)uStack_1c08;
      }
      auStack_1bc0._8_8_ = *(undefined8 *)(auStack_1660 + lVar36 * 0x20 + 8);
      auStack_1bc0._0_8_ = *(undefined8 *)(auStack_1660 + lVar36 * 0x20);
      psStack_1c48 = (secp256k1_gej *)(auStack_1960 + lVar36 * 0x40);
      uStack_1c30 = 1;
      do {
        auStack_1be0 = (undefined1  [16])0x0;
        auStack_1bf0 = (undefined1  [16])0x0;
        auStack_1c00 = (undefined1  [16])0x0;
        iStack_1bd0 = 0;
        if (((ulong)num_cores == 1) ||
           (psStack_1c10 = (secp256k1_context *)
                           ((long)&psStack_1c10[-0x1ffb86a1c1a8c2].ecmult_gen_ctx.ge_offset.infinity
                           + 3),
           (uint32_t)
           (((ulong)psStack_1c10 >> 0x20 ^ (ulong)psStack_1c10 & 0xffffffff) * (ulong)num_cores >>
           0x20) == this_core)) {
          if (uStack_1c30 < 7) {
            lVar36 = (uStack_1c30 - 1) * 0x20;
            sStack_1af0 = (&sStack_1650)[(uStack_1c30 - 1) * 2];
            auStack_1b00._8_8_ = *(undefined8 *)(auStack_1660 + lVar36 + 8);
            auStack_1b00._0_8_ = *(undefined8 *)(auStack_1660 + lVar36);
            iVar6 = 0xd - (int)uStack_1c30;
            if ((&iStack_1b94)[uStack_1c30] == 0) {
              iVar6 = (int)uStack_1c30;
            }
          }
          else {
            auStack_1b00 = *(undefined1 (*) [16])(secp256k1_ellswift_c4.n + uStack_1c30 * 4 + 1);
            sStack_1af0 = *(secp256k1_callback *)(secp256k1_ellswift_c4.n + uStack_1c30 * 4 + 3);
            iVar6 = -1;
          }
          iVar35 = 0;
          do {
            testrand256((uchar *)&sStack_1b50);
            secp256k1_schnorrsig_challenge
                      ((secp256k1_scalar *)&sStack_1b18,auStack_1b00,(uchar *)&sStack_1b50,0x20,
                       auStack_1bc0);
            uVar9 = sStack_1b18._0_8_ & 0xffffffff;
            if (*(int *)(auStack_1c00 + uVar9 * 4) == 0) {
              uVar33 = (int)sStack_1b18.magic * iVar5 + iVar6;
              iVar8 = 0;
              uVar18 = 0;
              do {
                if (iVar8 == 0xe) {
                  testrand256((uchar *)&sStack_1ae0);
                  uVar13 = 0;
                }
                else {
                  sStack_1ae0.fn = (_func_void_char_ptr_void_ptr *)0x0;
                  sStack_1ae0.data = (void *)0x0;
                  auStack_1ad0._0_15_ = SUB1615((undefined1  [16])0x0,0);
                  auStack_1ad0[0xf] = (char)iVar8;
                  uVar13 = 0;
                  if (iVar8 != 0xd && iVar6 != -1) {
                    uVar13 = (uint)(uVar33 - (uVar33 / 0xd + (uVar33 / 0xd) * 0xc) == iVar8);
                  }
                }
                psVar27 = psVar26;
                uVar14 = secp256k1_schnorrsig_verify
                                   (psVar26,auStack_1b00,(uchar *)&sStack_1b50,0x20,
                                    (secp256k1_xonly_pubkey *)psStack_1c48);
                if (uVar14 != uVar13) goto LAB_00117e3d;
                uVar18 = uVar18 + uVar13;
                iVar8 = iVar8 + 1;
              } while (iVar8 != 0xf);
              if (uVar18 != (iVar6 != -1)) goto LAB_00117e42;
              *(undefined4 *)(auStack_1c00 + uVar9 * 4) = 1;
              iVar35 = iVar35 + 1;
            }
          } while (iVar35 < 0xd);
        }
        uStack_1c30 = uStack_1c30 + 1;
      } while (uStack_1c30 != 0xe);
      uStack_1c08 = uStack_1c08 + 1;
    } while (uStack_1c08 != 7);
    lVar36 = 0x68;
    psVar32 = (secp256k1_scalar *)0x1;
    do {
      secp256k1_scalar_verify(psVar32);
      secp256k1_scalar_verify(psVar32);
      auStack_1b00 = (undefined1  [16])0x0;
      sStack_1af0._0_15_ = SUB1615((undefined1  [16])0x0,0);
      sStack_1af0.data._7_1_ = (char)psVar32;
      psVar27 = psVar26;
      iVar5 = secp256k1_ellswift_create(psVar26,auStack_1960,auStack_1b00,(uchar *)0x0);
      if (iVar5 == 0) goto LAB_00117e47;
      secp256k1_ellswift_decode(psVar26,(secp256k1_pubkey *)auStack_1660,auStack_1960);
      psVar27 = asStack_1360;
      secp256k1_pubkey_load(psVar26,(secp256k1_ge *)psVar27,(secp256k1_pubkey *)auStack_1660);
      iVar5 = secp256k1_ge_eq_var((secp256k1_ge *)psVar27,(secp256k1_ge *)(auStack_ee0 + lVar36));
      if (iVar5 == 0) goto LAB_00117e4c;
      lVar36 = lVar36 + 0x68;
      psVar32 = (secp256k1_scalar *)(ulong)((int)psVar32 + 1);
    } while (lVar36 != 0x548);
    secp256k1_context_destroy(psVar26);
    iVar5 = count;
  }
LAB_00117d93:
  main_cold_61();
LAB_00117d98:
  main_cold_57();
LAB_00117d9d:
  main_cold_56();
LAB_00117da2:
  main_cold_65();
LAB_00117da7:
  main_cold_64();
LAB_00117dac:
  main_cold_63();
LAB_00117db1:
  main_cold_10();
LAB_00117db6:
  main_cold_11();
LAB_00117dbb:
  main_cold_12();
LAB_00117dc0:
  main_cold_13();
LAB_00117dc5:
  main_cold_9();
LAB_00117dca:
  main_cold_40();
LAB_00117dcf:
  main_cold_39();
LAB_00117dd4:
  main_cold_38();
LAB_00117dd9:
  main_cold_37();
LAB_00117dde:
  main_cold_36();
LAB_00117de3:
  main_cold_35();
LAB_00117de8:
  main_cold_14();
LAB_00117ded:
  main_cold_34();
LAB_00117df2:
  main_cold_15();
LAB_00117df7:
  main_cold_33();
LAB_00117dfc:
  main_cold_16();
LAB_00117e01:
  main_cold_32();
LAB_00117e06:
  main_cold_31();
LAB_00117e0b:
  main_cold_17();
LAB_00117e10:
  main_cold_18();
LAB_00117e15:
  main_cold_19();
LAB_00117e1a:
  main_cold_20();
LAB_00117e1f:
  main_cold_30();
LAB_00117e24:
  main_cold_29();
LAB_00117e29:
  main_cold_28();
LAB_00117e2e:
  main_cold_27();
LAB_00117e33:
  main_cold_21();
LAB_00117e38:
  main_cold_22();
LAB_00117e3d:
  main_cold_23();
LAB_00117e42:
  main_cold_24();
LAB_00117e47:
  main_cold_26();
LAB_00117e4c:
  main_cold_25();
  lVar36 = 0;
  do {
    uVar30 = ((secp256k1_test_state[3] + secp256k1_test_state[0]) * 0x800000 |
             secp256k1_test_state[3] + secp256k1_test_state[0] >> 0x29) + secp256k1_test_state[0];
    uVar29 = secp256k1_test_state[1] << 0x11;
    uVar17 = secp256k1_test_state[2] ^ secp256k1_test_state[0];
    uVar9 = secp256k1_test_state[3] ^ secp256k1_test_state[1];
    secp256k1_test_state[1] = secp256k1_test_state[1] ^ uVar17;
    secp256k1_test_state[0] = secp256k1_test_state[0] ^ uVar9;
    secp256k1_test_state[3] = uVar9 << 0x2d | uVar9 >> 0x13;
    secp256k1_test_state[2] = uVar17 ^ uVar29;
    (psVar27->ecmult_gen_ctx).ge_offset.x.n[lVar36 + -1] = uVar30;
    lVar36 = lVar36 + 1;
  } while ((int)lVar36 != 4);
  return (int)secp256k1_test_state[0];
}

Assistant:

static int secp256k1_ecmult_const_xonly(secp256k1_fe* r, const secp256k1_fe *n, const secp256k1_fe *d, const secp256k1_scalar *q, int known_on_curve) {

    /* This algorithm is a generalization of Peter Dettman's technique for
     * avoiding the square root in a random-basepoint x-only multiplication
     * on a Weierstrass curve:
     * https://mailarchive.ietf.org/arch/msg/cfrg/7DyYY6gg32wDgHAhgSb6XxMDlJA/
     *
     *
     * === Background: the effective affine technique ===
     *
     * Let phi_u be the isomorphism that maps (x, y) on secp256k1 curve y^2 = x^3 + 7 to
     * x' = u^2*x, y' = u^3*y on curve y'^2 = x'^3 + u^6*7. This new curve has the same order as
     * the original (it is isomorphic), but moreover, has the same addition/doubling formulas, as
     * the curve b=7 coefficient does not appear in those formulas (or at least does not appear in
     * the formulas implemented in this codebase, both affine and Jacobian). See also Example 9.5.2
     * in https://www.math.auckland.ac.nz/~sgal018/crypto-book/ch9.pdf.
     *
     * This means any linear combination of secp256k1 points can be computed by applying phi_u
     * (with non-zero u) on all input points (including the generator, if used), computing the
     * linear combination on the isomorphic curve (using the same group laws), and then applying
     * phi_u^{-1} to get back to secp256k1.
     *
     * Switching to Jacobian coordinates, note that phi_u applied to (X, Y, Z) is simply
     * (X, Y, Z/u). Thus, if we want to compute (X1, Y1, Z) + (X2, Y2, Z), with identical Z
     * coordinates, we can use phi_Z to transform it to (X1, Y1, 1) + (X2, Y2, 1) on an isomorphic
     * curve where the affine addition formula can be used instead.
     * If (X3, Y3, Z3) = (X1, Y1) + (X2, Y2) on that curve, then our answer on secp256k1 is
     * (X3, Y3, Z3*Z).
     *
     * This is the effective affine technique: if we have a linear combination of group elements
     * to compute, and all those group elements have the same Z coordinate, we can simply pretend
     * that all those Z coordinates are 1, perform the computation that way, and then multiply the
     * original Z coordinate back in.
     *
     * The technique works on any a=0 short Weierstrass curve. It is possible to generalize it to
     * other curves too, but there the isomorphic curves will have different 'a' coefficients,
     * which typically does affect the group laws.
     *
     *
     * === Avoiding the square root for x-only point multiplication ===
     *
     * In this function, we want to compute the X coordinate of q*(n/d, y), for
     * y = sqrt((n/d)^3 + 7). Its negation would also be a valid Y coordinate, but by convention
     * we pick whatever sqrt returns (which we assume to be a deterministic function).
     *
     * Let g = y^2*d^3 = n^3 + 7*d^3. This also means y = sqrt(g/d^3).
     * Further let v = sqrt(d*g), which must exist as d*g = y^2*d^4 = (y*d^2)^2.
     *
     * The input point (n/d, y) also has Jacobian coordinates:
     *
     *     (n/d, y, 1)
     *   = (n/d * v^2, y * v^3, v)
     *   = (n/d * d*g, y * sqrt(d^3*g^3), v)
     *   = (n/d * d*g, sqrt(y^2 * d^3*g^3), v)
     *   = (n*g, sqrt(g/d^3 * d^3*g^3), v)
     *   = (n*g, sqrt(g^4), v)
     *   = (n*g, g^2, v)
     *
     * It is easy to verify that both (n*g, g^2, v) and its negation (n*g, -g^2, v) have affine X
     * coordinate n/d, and this holds even when the square root function doesn't have a
     * deterministic sign. We choose the (n*g, g^2, v) version.
     *
     * Now switch to the effective affine curve using phi_v, where the input point has coordinates
     * (n*g, g^2). Compute (X, Y, Z) = q * (n*g, g^2) there.
     *
     * Back on secp256k1, that means q * (n*g, g^2, v) = (X, Y, v*Z). This last point has affine X
     * coordinate X / (v^2*Z^2) = X / (d*g*Z^2). Determining the affine Y coordinate would involve
     * a square root, but as long as we only care about the resulting X coordinate, no square root
     * is needed anywhere in this computation.
     */

    secp256k1_fe g, i;
    secp256k1_ge p;
    secp256k1_gej rj;

    /* Compute g = (n^3 + B*d^3). */
    secp256k1_fe_sqr(&g, n);
    secp256k1_fe_mul(&g, &g, n);
    if (d) {
        secp256k1_fe b;
        VERIFY_CHECK(!secp256k1_fe_normalizes_to_zero(d));
        secp256k1_fe_sqr(&b, d);
        VERIFY_CHECK(SECP256K1_B <= 8); /* magnitude of b will be <= 8 after the next call */
        secp256k1_fe_mul_int(&b, SECP256K1_B);
        secp256k1_fe_mul(&b, &b, d);
        secp256k1_fe_add(&g, &b);
        if (!known_on_curve) {
            /* We need to determine whether (n/d)^3 + 7 is square.
             *
             *     is_square((n/d)^3 + 7)
             * <=> is_square(((n/d)^3 + 7) * d^4)
             * <=> is_square((n^3 + 7*d^3) * d)
             * <=> is_square(g * d)
             */
            secp256k1_fe c;
            secp256k1_fe_mul(&c, &g, d);
            if (!secp256k1_fe_is_square_var(&c)) return 0;
        }
    } else {
        secp256k1_fe_add_int(&g, SECP256K1_B);
        if (!known_on_curve) {
            /* g at this point equals x^3 + 7. Test if it is square. */
            if (!secp256k1_fe_is_square_var(&g)) return 0;
        }
    }

    /* Compute base point P = (n*g, g^2), the effective affine version of (n*g, g^2, v), which has
     * corresponding affine X coordinate n/d. */
    secp256k1_fe_mul(&p.x, &g, n);
    secp256k1_fe_sqr(&p.y, &g);
    p.infinity = 0;

    /* Perform x-only EC multiplication of P with q. */
    VERIFY_CHECK(!secp256k1_scalar_is_zero(q));
    secp256k1_ecmult_const(&rj, &p, q);
    VERIFY_CHECK(!secp256k1_gej_is_infinity(&rj));

    /* The resulting (X, Y, Z) point on the effective-affine isomorphic curve corresponds to
     * (X, Y, Z*v) on the secp256k1 curve. The affine version of that has X coordinate
     * (X / (Z^2*d*g)). */
    secp256k1_fe_sqr(&i, &rj.z);
    secp256k1_fe_mul(&i, &i, &g);
    if (d) secp256k1_fe_mul(&i, &i, d);
    secp256k1_fe_inv(&i, &i);
    secp256k1_fe_mul(r, &rj.x, &i);

    return 1;
}